

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

TextureFormatInfo * __thiscall
Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::GetTextureFormatInfo
          (RenderDeviceBase<Diligent::EngineGLImplTraits> *this,TEXTURE_FORMAT TexFormat)

{
  Char *pCVar1;
  undefined1 local_70 [8];
  string msg_1;
  TextureFormatInfoExt *TexFmtInfo;
  undefined1 local_38 [8];
  string msg;
  TEXTURE_FORMAT TexFormat_local;
  RenderDeviceBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._14_2_ = TexFormat;
  if (TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB < TexFormat) {
    FormatString<char[28]>((string *)local_38,(char (*) [28])"Texture format out of range");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetTextureFormatInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x110);
    std::__cxx11::string::~string((string *)local_38);
  }
  msg_1.field_2._8_8_ =
       std::
       vector<Diligent::TextureFormatInfoExt,_Diligent::STDAllocator<Diligent::TextureFormatInfoExt,_Diligent::IMemoryAllocator>_>
       ::operator[](&this->m_TextureFormatsInfo,(ulong)(ushort)msg.field_2._14_2_);
  if ((((const_reference)msg_1.field_2._8_8_)->super_TextureFormatInfo).super_TextureFormatAttribs.
      Format != msg.field_2._14_2_) {
    FormatString<char[20]>((string *)local_70,(char (*) [20])"Sanity check failed");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"GetTextureFormatInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x112);
    std::__cxx11::string::~string((string *)local_70);
  }
  return (TextureFormatInfo *)msg_1.field_2._8_8_;
}

Assistant:

GetTextureFormatInfo(TEXTURE_FORMAT TexFormat) const override final
    {
        VERIFY(TexFormat >= TEX_FORMAT_UNKNOWN && TexFormat < TEX_FORMAT_NUM_FORMATS, "Texture format out of range");
        const TextureFormatInfoExt& TexFmtInfo = m_TextureFormatsInfo[TexFormat];
        VERIFY(TexFmtInfo.Format == TexFormat, "Sanity check failed");
        return TexFmtInfo;
    }